

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O1

int mriStep_NlsResidual(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector X [3];
  ARKodeMRIStepMem local_58;
  ARKodeMem local_50;
  N_Vector local_48;
  N_Vector local_40;
  N_Vector local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  sunrealtype local_18;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"mriStep_NlsResidual",&local_50,&local_58);
  if (iVar1 == 0) {
    N_VLinearSum(0,0,local_58->zpred,zcor,local_50->ycur);
    iVar2 = (*local_58->nls_fsi)
                      (local_50->tcur,local_50->ycur,
                       local_58->Fsi[local_58->stage_map[local_58->istage]],local_50->user_data);
    local_58->nfsi = local_58->nfsi + 1;
    if (iVar2 < 0) {
      iVar1 = -8;
    }
    else {
      iVar1 = 9;
      if (iVar2 == 0) {
        local_28 = 0x3ff0000000000000;
        uStack_20 = 0xbff0000000000000;
        local_40 = local_58->sdata;
        local_18 = -local_58->gamma;
        local_38 = local_58->Fsi[local_58->stage_map[local_58->istage]];
        local_48 = zcor;
        iVar2 = N_VLinearCombination(3,&local_28,&local_48,r);
        iVar1 = -0x1c;
        if (iVar2 == 0) {
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mriStep_NlsResidual(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;
  sunrealtype c[3];
  N_Vector X[3];

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute slow implicit RHS and save for later */
  retval = step_mem->nls_fsi(ark_mem->tcur, ark_mem->ycur,
                             step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                             ark_mem->user_data);
  step_mem->nfsi++;
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  /* compute residual: zcor - gamma*Fsi - sdata */
  c[0]   = ONE;
  X[0]   = zcor;
  c[1]   = -ONE;
  X[1]   = step_mem->sdata;
  c[2]   = -step_mem->gamma;
  X[2]   = step_mem->Fsi[step_mem->stage_map[step_mem->istage]];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }
  return (ARK_SUCCESS);
}